

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O2

int __thiscall
ExtraData::getArrayHeader(ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val)

{
  uint flag;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int pos;
  char *pcVar6;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  TypedPropertyValue local_c0;
  TypedPropertyValue tmpVal;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"              ArrayHeader:          ");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<((ostream *)&std::cout,"                 Type:              ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,val);
  Utils::print_vec_from_to((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,0,4);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_f0);
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"MUST be set to the value obtained by clearing ");
  poVar5 = std::operator<<(poVar5,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,
                           "the VT_ARRAY (0x2000) bit of this array property\'s PropertyType value."
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,val);
  flag = Utils::vectFourBytesToUnsignedInt
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_108);
  tmpVal.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmpVal.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tmpVal.Padding.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tmpVal.Padding.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmpVal.Type.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmpVal.Padding.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmpVal.Type.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmpVal.Type.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tmpVal.Value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::TypedPropertyValue
            (&local_c0,&tmpVal);
  parseTypedPropertyValueTypeAndValue(this,false,flag,&local_c0);
  PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::~TypedPropertyValue(&local_c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138,val);
  iVar1 = Utils::lenFourBytesFromPos
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138,4);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_138);
  poVar5 = std::operator<<((ostream *)&std::cout,"                 NumDimensions:     ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150,val);
  iVar2 = Utils::lenFourBytesFromPos
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150,4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_150);
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"n unsigned integer representing the number of dimensions ");
  poVar5 = std::operator<<(poVar5,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"in the array property. MUST be at least 1 and at most 31.");
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar2 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  pos = 8;
  do {
    if (iVar1 == iVar2) {
      PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue::~TypedPropertyValue
                (&tmpVal);
      return pos;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"                 Dimension ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,":        ");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,val);
    iVar3 = Utils::lenFourBytesFromPos
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,pos);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_d8);
    poVar5 = std::operator<<((ostream *)&std::cout,"                   Size:            ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"An unsigned integer representing the size of the dimension.");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120,val);
    iVar4 = Utils::lenFourBytesFromPos
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120,pos + 4);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_120);
    poVar5 = std::operator<<((ostream *)&std::cout,"                   IndexOffset:     ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,
                             "A signed integer representing the index offset of the dimension.");
    std::endl<char,std::char_traits<char>>(poVar5);
    if (iVar4 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               (string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      pcVar6 = 
      "An array dimension that is to be accessed with a 0-based index would have the value zero.";
LAB_001127dd:
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else if (iVar4 == 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               (string *)&Utils::defaultOffsetDocInfo_abi_cxx11_);
      pcVar6 = 
      "An array dimension that is to be accessed with a 1-based index would have the value 0x00000001."
      ;
      goto LAB_001127dd;
    }
    pos = iVar3 + pos;
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

int ExtraData::getArrayHeader(std::vector<unsigned int> val) {
    cout << "              ArrayHeader:          " << endl;
    cout << "                 Type:              "; Utils::print_vec_from_to(val, 0, 4);
    cout << Utils::defaultOffsetDocInfo << "MUST be set to the value obtained by clearing " <<
            Utils::defaultOffsetDocInfo << "the VT_ARRAY (0x2000) bit of this array property's PropertyType value." << endl;
        unsigned int flag = Utils::vectFourBytesToUnsignedInt(val, 0);
        ExtraData::PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue tmpVal;
        ExtraData::parseTypedPropertyValueTypeAndValue(false, flag, tmpVal);
    int countOfDimen = Utils::lenFourBytesFromPos(val, 4);
    cout << "                 NumDimensions:     " << Utils::lenFourBytesFromPos(val, 4) << endl;
    cout << Utils::defaultOffsetDocInfo << "n unsigned integer representing the number of dimensions " <<
            Utils::defaultOffsetDocInfo << "in the array property. MUST be at least 1 and at most 31." << endl;
    int len = 8, size = 0, index = 0;
    for(int i = 0; i < countOfDimen; ++i) {
        cout << "                 Dimension " << dec << i << ":        " << endl;
        size = Utils::lenFourBytesFromPos(val, len);
        cout << "                   Size:            " << dec << size << endl <<
            Utils::defaultOffsetDocInfo << "An unsigned integer representing the size of the dimension." << endl;
        index = Utils::lenFourBytesFromPos(val, len + 4);
        cout << "                   IndexOffset:     " << hex << index << endl <<
             Utils::defaultOffsetDocInfo << "A signed integer representing the index offset of the dimension." << endl;
        if(index == 0x00000001)
            cout << Utils::defaultOffsetDocInfo << "An array dimension that is to be accessed with a 1-based index would have the value 0x00000001."
            << endl;
        if(index == 0)
            cout << Utils::defaultOffsetDocInfo << "An array dimension that is to be accessed with a 0-based index would have the value zero." << endl;
        len += size;
    }
    return len;
}